

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O1

bool __thiscall ON_ArcCurve::Read(ON_ArcCurve *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int major_version;
  int minor_version;
  int local_18 [2];
  
  local_18[0] = 0;
  local_18[1] = 0;
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,local_18,local_18 + 1);
  if (bVar1) {
    if (local_18[0] == 1) {
      bVar1 = ON_BinaryArchive::ReadArc(file,&this->m_arc);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::ReadInterval(file,&this->m_t);
      }
      if (bVar1 != false) {
        bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_dim);
      }
      if ((this->m_dim & 0xfffffffeU) != 2) {
        this->m_dim = 3;
      }
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool ON_ArcCurve::Read(
       ON_BinaryArchive& file // open binary file
     )
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc)
  {
    if (major_version==1) 
    {
      // common to all 1.x  versions
      rc = file.ReadArc( m_arc );
      if (rc) 
        rc = file.ReadInterval( m_t );
      if (rc) 
        rc = file.ReadInt(&m_dim);
      if ( m_dim != 2 && m_dim != 3 )
        m_dim = 3;
    }
    else
      rc = 0;
  }
  return rc;
}